

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O2

bool __thiscall
FilterReplayer::enqueue_create_raytracing_pipeline
          (FilterReplayer *this,Hash hash,VkRayTracingPipelineCreateInfoKHR *create_info,
          VkPipeline *pipeline)

{
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *this_00;
  size_type sVar1;
  VkPipelineLibraryCreateInfoKHR *pVVar2;
  uint32_t i_2;
  ulong uVar3;
  uint32_t i_3;
  uint32_t i;
  long lVar4;
  bool bVar5;
  VkPipeline local_40;
  Hash hash_local;
  
  *pipeline = (VkPipeline)hash;
  this_00 = &this->filter_raytracing;
  hash_local = hash;
  sVar1 = std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&this_00->_M_h,&hash_local);
  if (sVar1 == 0) {
    lVar4 = 0x18;
    bVar5 = false;
    for (uVar3 = 0; (!bVar5 && (uVar3 < create_info->stageCount)); uVar3 = uVar3 + 1) {
      local_40 = *(VkPipeline *)((long)&create_info->pStages->sType + lVar4);
      sVar1 = std::
              _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&(this->filter_modules)._M_h,(key_type *)&local_40);
      bVar5 = sVar1 != 0;
      lVar4 = lVar4 + 0x30;
    }
    uVar3 = 0;
    while (!bVar5) {
      pVVar2 = create_info->pLibraryInfo;
      if (pVVar2 == (VkPipelineLibraryCreateInfoKHR *)0x0) {
        return true;
      }
      if (pVVar2->libraryCount <= uVar3) {
        return true;
      }
      local_40 = pVVar2->pLibraries[uVar3];
      sVar1 = std::
              _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&this_00->_M_h,(key_type *)&local_40);
      uVar3 = uVar3 + 1;
      bVar5 = sVar1 != 0;
    }
  }
  if (create_info->basePipelineHandle != (VkPipeline)0x0) {
    local_40 = create_info->basePipelineHandle;
    std::__detail::
    _Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
    ::insert((_Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)this_00,(value_type *)&local_40);
  }
  lVar4 = 0x18;
  for (uVar3 = 0; uVar3 < create_info->stageCount; uVar3 = uVar3 + 1) {
    local_40 = *(VkPipeline *)((long)&create_info->pStages->sType + lVar4);
    std::__detail::
    _Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
    ::insert((_Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)&this->filter_modules_promoted,(value_type *)&local_40);
    lVar4 = lVar4 + 0x30;
  }
  pVVar2 = create_info->pLibraryInfo;
  if (pVVar2 != (VkPipelineLibraryCreateInfoKHR *)0x0) {
    for (uVar3 = 0; uVar3 < pVVar2->libraryCount; uVar3 = uVar3 + 1) {
      local_40 = pVVar2->pLibraries[uVar3];
      std::__detail::
      _Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert((_Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                *)this_00,(value_type *)&local_40);
      pVVar2 = create_info->pLibraryInfo;
    }
  }
  std::__detail::
  _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::insert((_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)this_00,&hash_local);
  return true;
}

Assistant:

bool enqueue_create_raytracing_pipeline(Hash hash, const VkRayTracingPipelineCreateInfoKHR *create_info, VkPipeline *pipeline) override
	{
		*pipeline = fake_handle<VkPipeline>(hash);

		// We are active if we either explicitly add the pipeline, or we explicitly add one of the module dependencies.
		bool active;
		if (filter_raytracing.count(hash) != 0)
		{
			active = true;
		}
		else
		{
			active = false;
			for (uint32_t i = 0; !active && i < create_info->stageCount; i++)
				active = filter_modules.count((Hash)create_info->pStages[i].module) != 0;
			for (uint32_t i = 0; !active && create_info->pLibraryInfo && i < create_info->pLibraryInfo->libraryCount; i++)
				active = filter_raytracing.count((Hash)create_info->pLibraryInfo->pLibraries[i]) != 0;
		}

		if (!active)
			return true;

		// If the pipeline is to be emitted, promote all dependencies to be active as well.
		if (create_info->basePipelineHandle != VK_NULL_HANDLE)
			filter_raytracing.insert((Hash)create_info->basePipelineHandle);
		for (uint32_t i = 0; i < create_info->stageCount; i++)
			filter_modules_promoted.insert((Hash)create_info->pStages[i].module);
		if (create_info->pLibraryInfo)
			for (uint32_t i = 0; i < create_info->pLibraryInfo->libraryCount; i++)
				filter_raytracing.insert((Hash)create_info->pLibraryInfo->pLibraries[i]);
		filter_raytracing.insert(hash);

		return true;
	}